

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

int __thiscall problem_parser::get_or_assign_variable(problem_parser *this,string_view value)

{
  ulong uVar1;
  string_view str;
  iterator iVar2;
  variable_type local_50 [3];
  int size;
  string_view value_local;
  string_view string;
  
  value_local._M_str = value._M_str;
  value_local._M_len = value._M_len;
  iVar2 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->m_cache_variable)._M_h,&value_local);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    uVar1 = (this->m_cache_variable)._M_h._M_element_count;
    if (uVar1 < 0x80000000) {
      str._M_str = value_local._M_str;
      str._M_len = value_local._M_len;
      size = (int)uVar1;
      string = baryonyx::string_buffer::append
                         ((this->m_problem).strings.
                          super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,str);
      std::
      unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
      ::try_emplace<int&>((unordered_map<std::basic_string_view<char,std::char_traits<char>>,int,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
                           *)&this->m_cache_variable,&string,&size);
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)&(this->m_problem).vars,&string);
      local_50[2] = 0;
      local_50[0] = real;
      local_50[1] = 0x7fffffff;
      std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>::
      emplace_back<int,int,baryonyx::variable_type>
                ((vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>> *)
                 &(this->m_problem).vars.values,(int *)(local_50 + 2),(int *)(local_50 + 1),local_50
                );
    }
    else {
      size = -1;
    }
  }
  else {
    size = *(int *)((long)iVar2.
                          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
                          ._M_cur + 0x18);
  }
  return size;
}

Assistant:

int get_or_assign_variable(const std::string_view value)
    {
        if (auto it = m_cache_variable.find(value);
            it != m_cache_variable.end())
            return it->second;

        if (m_cache_variable.size() > baryonyx::to_unsigned(INT_MAX))
            return -1;

        auto size = static_cast<int>(m_cache_variable.size());
        auto string = m_problem.strings->append(value);

        m_cache_variable.try_emplace(string, size);

        m_problem.vars.names.emplace_back(string);
        m_problem.vars.values.emplace_back(
          0, std::numeric_limits<int>::max(), baryonyx::variable_type::real);

        return size;
    }